

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall
kj::PathPtr::clone(PathPtr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *pcVar1;
  String *pSVar2;
  char *size;
  String *pSVar3;
  char *value;
  undefined8 *puVar4;
  String local_48;
  
  pSVar2 = (String *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,0,*(size_t *)(__fn + 8),(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  pSVar3 = pSVar2;
  if (*(long *)(__fn + 8) != 0) {
    puVar4 = *(undefined8 **)__fn;
    do {
      pcVar1 = (char *)puVar4[1];
      value = pcVar1;
      if (pcVar1 != (char *)0x0) {
        value = (char *)*puVar4;
      }
      size = pcVar1 + -1;
      if (pcVar1 == (char *)0x0) {
        size = (char *)0x0;
      }
      heapString(&local_48,value,(size_t)size);
      (pSVar3->content).ptr = local_48.content.ptr;
      (pSVar3->content).size_ = local_48.content.size_;
      (pSVar3->content).disposer = local_48.content.disposer;
      pSVar3 = pSVar3 + 1;
      puVar4 = puVar4 + 3;
    } while (puVar4 != (undefined8 *)(*(long *)(__fn + 8) * 0x18 + *(long *)__fn));
  }
  (this->parts).ptr = pSVar2;
  (this->parts).size_ = ((long)pSVar3 - (long)pSVar2 >> 3) * -0x5555555555555555;
  this[1].parts.ptr = (String *)&_::HeapArrayDisposer::instance;
  return (int)this;
}

Assistant:

Path PathPtr::clone() {
  return Path(KJ_MAP(p, parts) { return heapString(p); }, Path::ALREADY_CHECKED);
}